

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int BrotliDecoderIsFinished(BrotliDecoderStateInternal *s)

{
  int iVar1;
  byte local_11;
  BrotliDecoderStateInternal *s_local;
  
  if (s->state == BROTLI_STATE_DONE) {
    iVar1 = BrotliDecoderHasMoreOutput(s);
    local_11 = iVar1 != 0 ^ 0xff;
  }
  else {
    local_11 = 0;
  }
  return (int)(local_11 & 1);
}

Assistant:

BROTLI_BOOL BrotliDecoderIsFinished(const BrotliDecoderState* s) {
  return TO_BROTLI_BOOL(s->state == BROTLI_STATE_DONE) &&
      !BrotliDecoderHasMoreOutput(s);
}